

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_param_t * vrna_params(vrna_md_t *md)

{
  vrna_md_t *pvVar1;
  vrna_param_t *pvVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  int (*paiVar6) [8];
  int (*paiVar7) [5];
  int (*paaaiVar8) [8] [5] [5];
  int (*paaaaaiVar9) [8] [5] [5] [5] [5];
  int (*paiVar10) [8];
  int (*paaiVar11) [5] [5];
  int (*paiVar12) [5];
  int (*paaaiVar13) [8] [5] [5];
  int (*paaaaiVar14) [8] [5] [5] [5];
  int (*paiVar15) [8];
  int (*paaiVar16) [5] [5];
  int (*paiVar17) [5];
  int (*paaaiVar18) [8] [5] [5];
  int (*paaaaiVar19) [8] [5] [5] [5];
  ulong uVar20;
  vrna_param_t *pvVar21;
  int (*paaaiVar22) [8] [5] [5];
  uint uVar23;
  int (*paaiVar24) [5] [5];
  int (*paaaaiVar25) [8] [5] [5] [5];
  int (*paaiVar26) [5] [5];
  int (*paiVar27) [5];
  long lVar28;
  long lVar29;
  int (*paaiVar30) [5] [5];
  int (*paiVar31) [5];
  int (*paiVar32) [5];
  int (*paaaiVar33) [8] [5] [5];
  int (*paiVar34) [5];
  int (*paaaaiVar35) [8] [5] [5] [5];
  int (*paaaaiVar36) [8] [5] [5] [5];
  int (*paiVar37) [5];
  int (*paaaaaiVar38) [8] [5] [5] [5] [5];
  int (*paiVar39) [5];
  int *piVar40;
  int (*paiVar41) [5];
  int (*paaaaiVar42) [5] [5] [5] [5];
  long lVar43;
  long lVar44;
  int (*paaaaiVar45) [5] [5] [5] [5];
  ulong uVar46;
  int (*paaaaiVar47) [8] [5] [5] [5];
  int (*paiVar48) [5];
  int (*paaaaaiVar49) [8] [5] [5] [5] [5];
  int iVar50;
  double dVar51;
  vrna_md_t md_1;
  int aiStack_e0 [4];
  vrna_param_t *pvStack_d0;
  int (*paiStack_c8) [5];
  long lStack_c0;
  int (*paiStack_b8) [5];
  vrna_md_t *pvStack_b0;
  int (*paaaaaiStack_a8) [8] [5] [5] [5] [5];
  long lStack_a0;
  int (*paiStack_98) [5];
  int (*paiStack_90) [5];
  double dStack_88;
  int aiStack_80 [2];
  vrna_param_t *pvStack_78;
  long lStack_70;
  int (*paiStack_68) [5];
  int (*paiStack_60) [5];
  int (*paiStack_58) [5];
  int (*paiStack_50) [5];
  int (*paiStack_48) [5];
  int (*paiStack_40) [5];
  int (*paiStack_38) [5];
  
  if (md == (vrna_md_t *)0x0) {
    vrna_md_set_default((vrna_md_t *)&stack0xfffffffffffff810);
    pvVar2 = get_scaled_params((vrna_md_t *)&stack0xfffffffffffff810);
    return pvVar2;
  }
  aiStack_e0[0] = 0x120c57;
  aiStack_e0[1] = 0;
  pvStack_b0 = md;
  pvVar2 = (vrna_param_t *)vrna_alloc(0x33ea8);
  aiStack_e0[0] = 0x120c70;
  aiStack_e0[1] = 0;
  memset(pvVar2->param_file,0,0x100);
  aiStack_e0[0] = 0x120c75;
  aiStack_e0[1] = 0;
  pcVar3 = last_parameter_file();
  if (pcVar3 != (char *)0x0) {
    aiStack_e0[0] = 0x120c7f;
    aiStack_e0[1] = 0;
    pcVar3 = last_parameter_file();
    aiStack_e0[0] = 0x120c8f;
    aiStack_e0[1] = 0;
    strncpy(pvVar2->param_file,pcVar3,0xff);
  }
  pvVar1 = pvStack_b0;
  aiStack_e0[0] = 0x120ca8;
  aiStack_e0[1] = 0;
  memcpy(&pvVar2->model_details,pvStack_b0,0x7e8);
  dVar51 = pvVar1->temperature;
  pvVar2->temperature = dVar51;
  dStack_88 = (dVar51 + 273.15) / Tmeasure;
  pvVar2->ninio[2] = (int)((double)niniodH - (double)(niniodH - ninio37) * dStack_88);
  pvVar2->lxc = lxc37 * dStack_88;
  dVar51 = (double)MultipleCAdH;
  iVar50 = MultipleCAdH - MultipleCA37;
  pvVar2->TripleC = (int)((double)TripleCdH - (double)(TripleCdH - TripleC37) * dStack_88);
  pvVar2->MultipleCA = (int)(dVar51 - (double)iVar50 * dStack_88);
  pvVar2->MultipleCB =
       (int)((double)MultipleCBdH - (double)(MultipleCBdH - MultipleCB37) * dStack_88);
  dVar51 = (double)DuplexInitdH;
  iVar50 = DuplexInitdH - DuplexInit37;
  pvVar2->TerminalAU =
       (int)((double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dStack_88);
  pvVar2->DuplexInit = (int)(dVar51 - (double)iVar50 * dStack_88);
  pvVar2->MLbase = (int)((double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dStack_88);
  pvVar2->PS_penalty = -0x8a;
  pvVar2->PSM_penalty = 0x3ef;
  pvVar2->PSP_penalty = 0x5dc;
  pvVar2->PB_penalty = 0xf6;
  pvVar2->PUP_penalty = 6;
  pvVar2->PPS_penalty = 0x60;
  pvVar2->e_stP_penalty = 0.89;
  pvVar2->e_intP_penalty = 0.74;
  pvVar2->ap_penalty = 0x155;
  pvVar2->bp_penalty = 0x38;
  pvVar2->cp_penalty = 0xc;
  pvVar2->a_penalty = 0x153;
  pvVar2->b_penalty = 3;
  pvVar2->c_penalty = 2;
  pvVar2->MLclosing =
       (int)((double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dStack_88);
  pvVar2->gquadLayerMismatch =
       (int)((double)GQuadLayerMismatchH -
            (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dStack_88);
  pvVar2->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  piVar40 = pvVar2->gquad[2] + 3;
  lVar4 = 2;
  aiStack_80[0] = 0;
  aiStack_80[1] = 0;
  pvStack_d0 = pvVar2;
  do {
    lStack_c0 = CONCAT44(lStack_c0._4_4_,(int)lVar4 + -1);
    uVar20 = 0;
    paaaaaiStack_a8 = (int (*) [8] [5] [5] [5] [5])lVar4;
    do {
      paiStack_c8 = (int (*) [5])
                    ((double)GQuadBetadH - (double)(GQuadBetadH - GQuadBeta37) * dStack_88);
      iVar50 = (int)((double)GQuadAlphadH - (double)(GQuadAlphadH - GQuadAlpha37) * dStack_88) *
               (int)lStack_c0;
      uVar46 = uVar20 + 1;
      aiStack_e0[0] = 0x120f7f;
      aiStack_e0[1] = 0;
      paiStack_b8 = (int (*) [5])uVar20;
      dVar51 = log((double)(uVar46 & 0xffffffff));
      piVar40[(long)paiStack_b8] = (int)(dVar51 * (double)paiStack_c8) + iVar50;
      uVar20 = uVar46;
    } while (uVar46 != 0x2b);
    lVar4 = (long)paaaaaiStack_a8 + 1;
    piVar40 = piVar40 + 0x2e;
  } while (lVar4 != 8);
  lVar4 = 0;
  do {
    pvStack_d0->hairpin[lVar4] =
         (int)((double)hairpindH[lVar4] - (double)(hairpindH[lVar4] - hairpin37[lVar4]) * dStack_88)
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1f);
  lVar4 = 0;
  do {
    *(int *)((long)pvStack_d0->bulge + lVar4) =
         (int)((double)*(int *)((long)bulgedH + lVar4) -
              (double)(*(int *)((long)bulgedH + lVar4) - *(int *)((long)bulge37 + lVar4)) *
              dStack_88);
    *(int *)((long)pvStack_d0->internal_loop + lVar4) =
         (int)((double)*(int *)((long)internal_loopdH + lVar4) -
              (double)(*(int *)((long)internal_loopdH + lVar4) -
                      *(int *)((long)internal_loop37 + lVar4)) * dStack_88);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x7c);
  if (Tetraloops[0] != '\0') {
    uVar20 = 0;
    uVar23 = 7;
    do {
      pvStack_d0->Tetraloop_E[uVar20] =
           (int)((double)TetraloopdH[uVar20] -
                (double)(TetraloopdH[uVar20] - Tetraloop37[uVar20]) * dStack_88);
      uVar20 = (ulong)((int)uVar20 + 1);
      uVar46 = (ulong)uVar23;
      aiStack_e0[0] = 0x1210f2;
      aiStack_e0[1] = 0;
      sVar5 = strlen(Tetraloops);
      uVar23 = uVar23 + 7;
    } while (uVar46 < sVar5);
  }
  if (Triloops[0] != '\0') {
    uVar20 = 0;
    uVar23 = 5;
    do {
      pvStack_d0->Triloop_E[uVar20] =
           (int)((double)TriloopdH[uVar20] -
                (double)(TriloopdH[uVar20] - Triloop37[uVar20]) * dStack_88);
      uVar20 = (ulong)((int)uVar20 + 1);
      uVar46 = (ulong)uVar23;
      aiStack_e0[0] = 0x121167;
      aiStack_e0[1] = 0;
      sVar5 = strlen(Triloops);
      uVar23 = uVar23 + 5;
    } while (uVar46 < sVar5);
  }
  if (Hexaloops[0] != '\0') {
    uVar20 = 0;
    uVar23 = 9;
    do {
      pvStack_d0->Hexaloop_E[uVar20] =
           (int)((double)HexaloopdH[uVar20] -
                (double)(HexaloopdH[uVar20] - Hexaloop37[uVar20]) * dStack_88);
      uVar20 = (ulong)((int)uVar20 + 1);
      uVar46 = (ulong)uVar23;
      aiStack_e0[0] = 0x1211dc;
      aiStack_e0[1] = 0;
      sVar5 = strlen(Hexaloops);
      uVar23 = uVar23 + 9;
    } while (uVar46 < sVar5);
  }
  pvVar2 = pvStack_d0;
  lVar4 = 0xc767;
  do {
    *(int *)((long)(pvStack_d0->stack + -1) + 0x1c + lVar4 * 4) =
         (int)((double)ML_interndH - (double)(ML_interndH - ML_intern37) * dStack_88);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xc76f);
  paiVar6 = pvStack_d0->stack;
  paiVar10 = stackdH;
  paiVar15 = stack37;
  lVar4 = 0;
  do {
    lVar29 = 0;
    do {
      (*paiVar6)[lVar29] =
           (int)((double)(*paiVar10)[lVar29] -
                (double)((*paiVar10)[lVar29] - (*paiVar15)[lVar29]) * dStack_88);
      lVar29 = lVar29 + 1;
    } while (lVar29 != 8);
    lVar4 = lVar4 + 1;
    paiVar10 = paiVar10 + 1;
    paiVar15 = paiVar15 + 1;
    paiVar6 = paiVar6 + 1;
  } while (lVar4 != 8);
  paaiVar11 = mismatchIdH;
  paaiVar24 = mismatchI37;
  paaiVar16 = mismatchHdH;
  paaiVar26 = mismatchH37;
  paaiVar30 = mismatch1nIdH;
  paiVar7 = mismatch23IdH[0];
  paiVar12 = mismatchExt37[0];
  paiVar17 = mismatch1nI37[0];
  paiVar27 = mismatch23I37[0];
  paiVar31 = mismatchMdH[0];
  paiVar32 = mismatchExtdH[0];
  pvVar21 = pvStack_d0;
  lVar4 = 0;
  paiVar34 = mismatchM37[0];
  do {
    paiStack_58 = paiVar34;
    lStack_70 = lVar4;
    pvStack_78 = pvVar21;
    paiStack_60 = paiVar32;
    paiStack_50 = paiVar31;
    paiStack_48 = paiVar27;
    paiStack_38 = paiVar17;
    paiStack_68 = paiVar12;
    paiStack_40 = paiVar7;
    lVar4 = 0;
    paiVar7 = *paaiVar11;
    paiVar12 = *paaiVar16;
    pvVar21 = pvStack_78;
    paiVar17 = *paaiVar24;
    paiVar27 = *paaiVar26;
    paiVar31 = *paaiVar30;
    paiVar32 = paiStack_38;
    paiVar34 = paiStack_40;
    paiVar37 = paiStack_48;
    paiVar39 = paiStack_50;
    paiVar41 = paiStack_60;
    paiVar48 = paiStack_58;
    paiStack_c8 = paiStack_68;
    do {
      lVar29 = 0;
      do {
        iVar50 = *(int *)((long)*(int (*) [5])*paiVar7 + lVar29);
        *(int *)((long)pvVar21->mismatchI[0][0] + lVar29) =
             (int)((double)iVar50 -
                  (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiVar17 + lVar29)) * dStack_88);
        iVar50 = *(int *)((long)*(int (*) [5])*paiVar12 + lVar29);
        *(int *)((long)pvVar21->mismatchH[0][0] + lVar29) =
             (int)((double)iVar50 -
                  (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiVar27 + lVar29)) * dStack_88);
        iVar50 = *(int *)((long)*(int (*) [5])*paiVar31 + lVar29);
        *(int *)((long)pvVar21->mismatch1nI[0][0] + lVar29) =
             (int)((double)iVar50 -
                  (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiVar32 + lVar29)) * dStack_88);
        iVar50 = *(int *)((long)*(int (*) [5])*paiVar34 + lVar29);
        *(int *)((long)pvVar21->mismatch23I[0][0] + lVar29) =
             (int)((double)iVar50 -
                  (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiVar37 + lVar29)) * dStack_88);
        if (pvStack_b0->dangles == 0) {
          *(undefined4 *)((long)pvVar21->mismatchExt[0][0] + lVar29) = 0;
          uVar23 = 0;
          lVar43 = 0x1218;
        }
        else {
          iVar50 = *(int *)((long)*(int (*) [5])*paiVar39 + lVar29);
          uVar23 = (uint)((double)iVar50 -
                         (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiVar48 + lVar29)) *
                         dStack_88);
          *(uint *)((long)pvVar21->mismatchM[0][0] + lVar29) = (int)uVar23 >> 0x1f & uVar23;
          iVar50 = *(int *)((long)*(int (*) [5])*paiVar41 + lVar29);
          uVar23 = (uint)((double)iVar50 -
                         (double)(iVar50 - *(int *)((long)*(int (*) [5])*paiStack_c8 + lVar29)) *
                         dStack_88);
          uVar23 = (int)uVar23 >> 0x1f & uVar23;
          lVar43 = 0x278;
        }
        *(uint *)((long)(pvVar21->stack + -1) + 0x1c + lVar29 + lVar43) = uVar23;
        lVar29 = lVar29 + 4;
      } while (lVar29 != 0x14);
      lVar4 = lVar4 + 1;
      pvVar21 = (vrna_param_t *)(pvVar21->stack[0] + 4);
      paiVar7 = paiVar7 + 1;
      paiVar17 = paiVar17 + 1;
      paiVar12 = paiVar12 + 1;
      paiVar27 = paiVar27 + 1;
      paiVar31 = paiVar31 + 1;
      paiVar32 = paiVar32 + 1;
      paiVar34 = paiVar34 + 1;
      paiVar37 = paiVar37 + 1;
      paiVar39 = paiVar39 + 1;
      paiVar48 = paiVar48 + 1;
      paiVar41 = paiVar41 + 1;
      paiStack_c8 = paiStack_c8 + 1;
    } while (lVar4 != 5);
    paaiVar11 = (int (*) [5] [5])((long)paaiVar11 + 100);
    paaiVar24 = (int (*) [5] [5])((long)paaiVar24 + 100);
    paaiVar16 = (int (*) [5] [5])((long)paaiVar16 + 100);
    paaiVar26 = (int (*) [5] [5])((long)paaiVar26 + 100);
    paaiVar30 = (int (*) [5] [5])((long)paaiVar30 + 100);
    paiVar7 = paiStack_40 + 5;
    paiVar12 = paiStack_68 + 5;
    paiVar17 = paiStack_38 + 5;
    paiVar27 = paiStack_48 + 5;
    paiVar31 = paiStack_50 + 5;
    paiVar32 = paiStack_60 + 5;
    pvVar21 = (vrna_param_t *)(pvStack_78->stack + 3);
    lVar4 = lStack_70 + 1;
    paiVar34 = paiStack_58 + 5;
  } while (lStack_70 + 1 != 8);
  paiVar7 = pvStack_d0->dangle5;
  paiVar12 = dangle5_dH;
  paiVar17 = dangle5_37;
  paiVar27 = dangle3_dH;
  paiVar31 = dangle3_37;
  lVar4 = 0;
  do {
    lVar29 = 0;
    do {
      iVar50 = *(int *)((long)*paiVar12 + lVar29);
      uVar23 = (uint)((double)iVar50 -
                     (double)(iVar50 - *(int *)((long)*paiVar17 + lVar29)) * dStack_88);
      *(uint *)((long)*paiVar7 + lVar29) = (int)uVar23 >> 0x1f & uVar23;
      iVar50 = *(int *)((long)*paiVar27 + lVar29);
      uVar23 = (uint)((double)iVar50 -
                     (double)(iVar50 - *(int *)((long)*paiVar31 + lVar29)) * dStack_88);
      *(uint *)((long)paiVar7[8] + lVar29) = (int)uVar23 >> 0x1f & uVar23;
      lVar29 = lVar29 + 4;
    } while (lVar29 != 0x14);
    lVar4 = lVar4 + 1;
    paiVar12 = paiVar12 + 1;
    paiVar17 = paiVar17 + 1;
    paiVar7 = paiVar7 + 1;
    paiVar27 = paiVar27 + 1;
    paiVar31 = paiVar31 + 1;
  } while (lVar4 != 8);
  paaaiVar8 = pvStack_d0->int11;
  paaaiVar13 = int11_dH;
  paaaiVar18 = int11_37;
  lVar4 = 0;
  do {
    lVar29 = 0;
    paaaiVar33 = paaaiVar8;
    paiVar7 = (int (*) [5])paaaiVar18;
    paiVar12 = (int (*) [5])paaaiVar13;
    do {
      lVar43 = 0;
      paaaiVar22 = paaaiVar33;
      paiVar27 = paiVar7;
      paiVar17 = paiVar12;
      do {
        lVar44 = 0;
        do {
          iVar50 = (*(int (*) [5] [5])*paiVar17)[0][lVar44];
          (*paaaiVar22)[0][0][lVar44] =
               (int)((double)iVar50 -
                    (double)(iVar50 - (*(int (*) [5] [5])*paiVar27)[0][lVar44]) * dStack_88);
          lVar44 = lVar44 + 1;
        } while (lVar44 != 5);
        lVar43 = lVar43 + 1;
        paiVar17 = paiVar17 + 1;
        paiVar27 = paiVar27 + 1;
        paaaiVar22 = (int (*) [8] [5] [5])((*paaaiVar22)[0] + 1);
      } while (lVar43 != 5);
      lVar29 = lVar29 + 1;
      paiVar12 = paiVar12 + 5;
      paiVar7 = paiVar7 + 5;
      paaaiVar33 = (int (*) [8] [5] [5])(*paaaiVar33 + 1);
    } while (lVar29 != 8);
    lVar4 = lVar4 + 1;
    paaaiVar13 = (int (*) [8] [5] [5])((long)paaaiVar13 + 800);
    paaaiVar18 = (int (*) [8] [5] [5])((long)paaaiVar18 + 800);
    paaaiVar8 = paaaiVar8 + 1;
  } while (lVar4 != 8);
  paaaaiVar35 = pvStack_d0->int21;
  paaaaiVar14 = int21_dH;
  paaaaiVar19 = int21_37;
  lVar4 = 0;
  do {
    lVar29 = 0;
    paiVar7 = (int (*) [5])paaaaiVar14;
    paiVar12 = (int (*) [5])paaaaiVar19;
    paaaaiVar36 = paaaaiVar35;
    do {
      lVar43 = 0;
      paiVar17 = paiVar12;
      paiVar27 = paiVar7;
      paaaaiVar47 = paaaaiVar36;
      do {
        lVar44 = 0;
        paaaaiVar25 = paaaaiVar47;
        paiVar31 = paiVar27;
        paiVar32 = paiVar17;
        do {
          lVar28 = 0;
          do {
            iVar50 = (*(int (*) [5] [5] [5])*paiVar31)[0][0][lVar28];
            (*paaaaiVar25)[0][0][0][lVar28] =
                 (int)((double)iVar50 -
                      (double)(iVar50 - (*(int (*) [5] [5] [5])*paiVar32)[0][0][lVar28]) * dStack_88
                      );
            lVar28 = lVar28 + 1;
          } while (lVar28 != 5);
          lVar44 = lVar44 + 1;
          paiVar31 = paiVar31 + 1;
          paiVar32 = paiVar32 + 1;
          paaaaiVar25 = (int (*) [8] [5] [5] [5])((*paaaaiVar25)[0][0] + 1);
        } while (lVar44 != 5);
        lVar43 = lVar43 + 1;
        paiVar27 = (int (*) [5])(*paiVar27 + 0x19);
        paiVar17 = (int (*) [5])(*paiVar17 + 0x19);
        paaaaiVar47 = (int (*) [8] [5] [5] [5])((*paaaaiVar47)[0] + 1);
      } while (lVar43 != 5);
      lVar29 = lVar29 + 1;
      paiVar7 = paiVar7 + 0x19;
      paiVar12 = paiVar12 + 0x19;
      paaaaiVar36 = (int (*) [8] [5] [5] [5])(*paaaaiVar36 + 1);
    } while (lVar29 != 8);
    lVar4 = lVar4 + 1;
    paaaaiVar14 = (int (*) [8] [5] [5] [5])((long)paaaaiVar14 + 4000);
    paaaaiVar19 = (int (*) [8] [5] [5] [5])((long)paaaaiVar19 + 4000);
    paaaaiVar35 = paaaaiVar35 + 1;
  } while (lVar4 != 8);
  paaaaaiVar9 = pvStack_d0->int22;
  paiVar7 = (int (*) [5])int22_dH;
  paiVar12 = (int (*) [5])int22_37;
  lVar4 = 0;
  do {
    lStack_a0 = lVar4;
    paiStack_98 = paiVar12;
    paiStack_90 = paiVar7;
    paaaaaiStack_a8 = paaaaaiVar9;
    paaaaaiVar9 = paaaaaiStack_a8;
    paiVar7 = paiStack_98;
    paiVar12 = paiStack_90;
    lVar4 = 0;
    do {
      lStack_c0 = lVar4;
      paiStack_b8 = paiVar12;
      paiStack_c8 = paiVar7;
      pvStack_b0 = (vrna_md_t *)paaaaaiVar9;
      lVar4 = 0;
      paaaaaiVar9 = (int (*) [8] [5] [5] [5] [5])pvStack_b0;
      paiVar7 = paiStack_b8;
      paiVar12 = paiStack_c8;
      do {
        lVar29 = 0;
        paiVar17 = paiVar7;
        paaaaaiVar38 = paaaaaiVar9;
        paiVar27 = paiVar12;
        do {
          lVar43 = 0;
          paaaaiVar42 = (int (*) [5] [5] [5] [5])paiVar27;
          paaaaiVar45 = (int (*) [5] [5] [5] [5])paiVar17;
          paaaaaiVar49 = paaaaaiVar38;
          do {
            lVar44 = 0;
            do {
              iVar50 = (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar45)[0][0][0][lVar44];
              (*paaaaaiVar49)[0][0][0][0][lVar44] =
                   (int)((double)iVar50 -
                        (double)(iVar50 - (*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaiVar42)[0]
                                          [0][0][lVar44]) * dStack_88);
              lVar44 = lVar44 + 1;
            } while (lVar44 != 5);
            lVar43 = lVar43 + 1;
            paaaaiVar45 = (int (*) [5] [5] [5] [5])((long)paaaaiVar45 + 0x14);
            paaaaiVar42 = (int (*) [5] [5] [5] [5])((long)paaaaiVar42 + 0x14);
            paaaaaiVar49 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar49)[0][0][0] + 1);
          } while (lVar43 != 5);
          lVar29 = lVar29 + 1;
          paiVar17 = (int (*) [5])(*paiVar17 + 0x19);
          paiVar27 = (int (*) [5])(*paiVar27 + 0x19);
          paaaaaiVar38 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar38)[0][0] + 1);
        } while (lVar29 != 5);
        lVar4 = lVar4 + 1;
        paiVar7 = paiVar7 + 0x19;
        paiVar12 = paiVar12 + 0x19;
        paaaaaiVar9 = (int (*) [8] [5] [5] [5] [5])((*paaaaaiVar9)[0] + 1);
      } while (lVar4 != 5);
      paaaaaiVar9 = (int (*) [8] [5] [5] [5] [5])(*(int (*) [8] [5] [5] [5] [5])pvStack_b0 + 1);
      paiVar7 = paiStack_c8 + 0x7d;
      paiVar12 = paiStack_b8 + 0x7d;
      lVar4 = lStack_c0 + 1;
    } while (lStack_c0 + 1 != 8);
    paaaaaiVar9 = paaaaaiStack_a8 + 1;
    paiVar7 = paiStack_90 + 1000;
    paiVar12 = paiStack_98 + 1000;
    lVar4 = lStack_a0 + 1;
  } while (lStack_a0 + 1 != 8);
  aiStack_e0[0] = 0x121945;
  aiStack_e0[1] = 0;
  strncpy(pvStack_d0->Tetraloops,Tetraloops,0x119);
  aiStack_e0[0] = 0x12195d;
  aiStack_e0[1] = 0;
  strncpy(pvVar2->Triloops,Triloops,0xf1);
  aiStack_e0[0] = 0x121978;
  aiStack_e0[1] = 0;
  strncpy(pvVar2->Hexaloops,Hexaloops,0x169);
  id = id + 1;
  pvVar2->id = id;
  return pvVar2;
}

Assistant:

PUBLIC vrna_param_t *
vrna_params(vrna_md_t *md)
{
  if (md) {
    return get_scaled_params(md);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_scaled_params(&md);
  }
}